

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::errors<char[25],char[27],char[11],char[27]>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*args) [25],char (*args_1) [27]
          ,char (*args_2) [11],char (*args_3) [27])

{
  long *plVar1;
  long *plVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type *psVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1b1;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170 [2];
  long local_160 [2];
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110 [2];
  undefined1 local_100 [16];
  pointer local_f0 [2];
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  long local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_110[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"constraint not satisfied","")
  ;
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_110,0,(char *)0x0,0x125f30);
  local_190 = &local_180;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_180 = *plVar2;
    lStack_178 = plVar1[3];
  }
  else {
    local_180 = *plVar2;
    local_190 = (long *)*plVar1;
  }
  local_188 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_4_ = (undefined4)plVar1[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_d0._M_allocated_capacity = (size_type)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_e0 + 0x10),"type_<.*impl>::is_abstract","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)(local_e0 + 0x10),0,(char *)0x0,0x125f30);
  local_1b0 = &local_1a0;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_1a0 = *plVar2;
    lStack_198 = plVar1[3];
  }
  else {
    local_1a0 = *plVar2;
    local_1b0 = (long *)*plVar1;
  }
  local_1a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_90 = &local_80;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    uStack_78 = (undefined4)plVar1[3];
    uStack_74 = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"pure.*impl","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_170,0,(char *)0x0,0x125f30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_120 = *plVar2;
    lStack_118 = plVar1[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar2;
    local_130 = (long *)*plVar1;
  }
  local_128 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_70 = &local_60;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    uStack_58 = (undefined4)plVar1[3];
    uStack_54 = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_f0[0] = (pointer)local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"virtual void dummy().*=.*0","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x125f30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_140 = *plVar2;
    lStack_138 = plVar1[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar2;
    local_150 = (long *)*plVar1;
  }
  local_148 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  plVar1 = local_40;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_40[0] = *plVar5;
    local_40[1] = plVar2[3];
    local_50 = plVar1;
  }
  else {
    local_40[0] = *plVar5;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __l._M_len = 4;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_1b1);
  lVar6 = -0x80;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_f0[0] != (pointer)local_e0) {
    operator_delete(local_f0[0],(ulong)(local_e0._0_8_ + 1));
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((long *)local_d0._M_allocated_capacity != local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0] + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_100;
  if (local_110[0] != pvVar3) {
    operator_delete(local_110[0],(ulong)((long)&((_Alloc_hider *)local_100._0_8_)->_M_p + 1));
    pvVar3 = extraout_RAX;
  }
  return pvVar3;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}